

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_quad_mesh.h
# Opt level: O2

PrimInfo * __thiscall
embree::sse2::QuadMeshISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,QuadMeshISA *this,mvector<PrimRef> *prims,size_t itime,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  long lVar3;
  BufferView<embree::Vec3fa> *pBVar4;
  ulong uVar5;
  char *pcVar6;
  size_t sVar7;
  PrimRef *pPVar8;
  size_t sVar9;
  ulong uVar10;
  undefined4 uVar11;
  size_t sVar12;
  unsigned_long uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  undefined1 auVar22 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  sVar9 = 0;
  aVar18 = _DAT_01f45a40;
  aVar19 = _DAT_01f45a30;
  aVar20 = _DAT_01f45a40;
  aVar21 = _DAT_01f45a30;
  for (uVar13 = r->_begin; uVar13 < r->_end; uVar13 = uVar13 + 1) {
    lVar3 = *(long *)&(this->super_QuadMesh).super_Geometry.field_0x58;
    pBVar4 = (this->super_QuadMesh).vertices.items;
    lVar16 = *(long *)&(this->super_QuadMesh).field_0x68 * uVar13;
    uVar15 = (ulong)*(uint *)(lVar3 + lVar16);
    uVar5 = (pBVar4->super_RawBufferView).num;
    sVar12 = k;
    if ((((uVar15 < uVar5) && (uVar17 = (ulong)*(uint *)(lVar3 + 4 + lVar16), uVar17 < uVar5)) &&
        (uVar10 = (ulong)*(uint *)(lVar3 + 8 + lVar16), uVar10 < uVar5)) &&
       (uVar14 = (ulong)*(uint *)(lVar3 + 0xc + lVar16), uVar14 < uVar5)) {
      pcVar6 = pBVar4[itime].super_RawBufferView.ptr_ofs;
      sVar7 = pBVar4[itime].super_RawBufferView.stride;
      auVar22 = *(undefined1 (*) [16])(pcVar6 + sVar7 * uVar15);
      auVar24._0_4_ = -(uint)(auVar22._0_4_ < 1.844e+18 && -1.844e+18 < auVar22._0_4_);
      auVar24._4_4_ = -(uint)(auVar22._4_4_ < 1.844e+18 && -1.844e+18 < auVar22._4_4_);
      auVar24._8_4_ = -(uint)(auVar22._8_4_ < 1.844e+18 && -1.844e+18 < auVar22._8_4_);
      auVar24._12_4_ = -(uint)(auVar22._12_4_ < 1.844e+18 && -1.844e+18 < auVar22._12_4_);
      uVar11 = movmskps((int)(sVar7 * uVar15),auVar24);
      if ((~(byte)uVar11 & 7) == 0) {
        auVar24 = *(undefined1 (*) [16])(pcVar6 + sVar7 * uVar17);
        auVar2._4_4_ = -(uint)(auVar24._4_4_ < 1.844e+18 && -1.844e+18 < auVar24._4_4_);
        auVar2._0_4_ = -(uint)(auVar24._0_4_ < 1.844e+18 && -1.844e+18 < auVar24._0_4_);
        auVar2._8_4_ = -(uint)(auVar24._8_4_ < 1.844e+18 && -1.844e+18 < auVar24._8_4_);
        auVar2._12_4_ = -(uint)(auVar24._12_4_ < 1.844e+18 && -1.844e+18 < auVar24._12_4_);
        uVar11 = movmskps((int)(sVar7 * uVar17),auVar2);
        if ((~(byte)uVar11 & 7) == 0) {
          auVar2 = *(undefined1 (*) [16])(pcVar6 + sVar7 * uVar10);
          auVar25._0_4_ = -(uint)(-1.844e+18 < auVar2._0_4_ && auVar2._0_4_ < 1.844e+18);
          auVar25._4_4_ = -(uint)(-1.844e+18 < auVar2._4_4_ && auVar2._4_4_ < 1.844e+18);
          auVar25._8_4_ = -(uint)(-1.844e+18 < auVar2._8_4_ && auVar2._8_4_ < 1.844e+18);
          auVar25._12_4_ = -(uint)(-1.844e+18 < auVar2._12_4_ && auVar2._12_4_ < 1.844e+18);
          uVar11 = movmskps((int)(sVar7 * uVar10),auVar25);
          if ((~(byte)uVar11 & 7) == 0) {
            auVar25 = *(undefined1 (*) [16])(pcVar6 + sVar7 * uVar14);
            auVar29._0_4_ = -(uint)(auVar25._0_4_ < 1.844e+18 && -1.844e+18 < auVar25._0_4_);
            auVar29._4_4_ = -(uint)(auVar25._4_4_ < 1.844e+18 && -1.844e+18 < auVar25._4_4_);
            auVar29._8_4_ = -(uint)(auVar25._8_4_ < 1.844e+18 && -1.844e+18 < auVar25._8_4_);
            auVar29._12_4_ = -(uint)(auVar25._12_4_ < 1.844e+18 && -1.844e+18 < auVar25._12_4_);
            uVar11 = movmskps((int)(sVar7 * uVar14),auVar29);
            if ((~(byte)uVar11 & 7) == 0) {
              pcVar6 = pBVar4[itime + 1].super_RawBufferView.ptr_ofs;
              sVar7 = pBVar4[itime + 1].super_RawBufferView.stride;
              pfVar1 = (float *)(pcVar6 + uVar15 * sVar7);
              auVar32._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
              auVar32._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
              auVar32._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
              auVar32._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
              uVar11 = movmskps(CONCAT31((int3)((uint)uVar11 >> 8),~(byte)uVar11),auVar32);
              if ((~(byte)uVar11 & 7) == 0) {
                pfVar1 = (float *)(pcVar6 + uVar17 * sVar7);
                auVar26._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
                auVar26._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
                auVar26._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
                auVar26._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
                uVar11 = movmskps(CONCAT31((int3)((uint)uVar11 >> 8),~(byte)uVar11),auVar26);
                if ((~(byte)uVar11 & 7) == 0) {
                  pfVar1 = (float *)(pcVar6 + uVar10 * sVar7);
                  auVar27._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
                  auVar27._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
                  auVar27._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
                  auVar27._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
                  uVar11 = movmskps(CONCAT31((int3)((uint)uVar11 >> 8),~(byte)uVar11),auVar27);
                  if ((~(byte)uVar11 & 7) == 0) {
                    pfVar1 = (float *)(pcVar6 + sVar7 * uVar14);
                    auVar28._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
                    auVar28._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
                    auVar28._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
                    auVar28._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
                    uVar11 = movmskps(CONCAT31((int3)((uint)uVar11 >> 8),~(byte)uVar11),auVar28);
                    if ((~(byte)uVar11 & 7) == 0) {
                      auVar29 = minps(auVar22,auVar24);
                      auVar32 = minps(auVar2,auVar25);
                      auVar29 = minps(auVar29,auVar32);
                      auVar22 = maxps(auVar22,auVar24);
                      auVar24 = maxps(auVar2,auVar25);
                      auVar22 = maxps(auVar22,auVar24);
                      aVar30._0_12_ = auVar29._0_12_;
                      aVar30.m128[3] = (float)geomID;
                      aVar23._0_12_ = auVar22._0_12_;
                      aVar23.m128[3] = (float)uVar13;
                      aVar21.m128 = (__m128)minps(aVar21.m128,aVar30.m128);
                      aVar20.m128 = (__m128)maxps(aVar20.m128,aVar23.m128);
                      sVar12 = k + 1;
                      pPVar8 = prims->items;
                      pPVar8[k].lower.field_0 = aVar30;
                      auVar31._0_4_ = auVar29._0_4_ + auVar22._0_4_;
                      auVar31._4_4_ = auVar29._4_4_ + auVar22._4_4_;
                      auVar31._8_4_ = auVar29._8_4_ + auVar22._8_4_;
                      auVar31._12_4_ = (float)geomID + (float)uVar13;
                      aVar19.m128 = (__m128)minps(aVar19.m128,auVar31);
                      aVar18.m128 = (__m128)maxps(aVar18.m128,auVar31);
                      sVar9 = sVar9 + 1;
                      pPVar8[k].upper.field_0 = aVar23;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    k = sVar12;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar21;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar20;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar19;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar18;
  __return_storage_ptr__->end = sVar9;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,itime,bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }